

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O2

Value * soul::generateWaveform
                  (Value *__return_storage_ptr__,double frequency,double sampleRate,
                  int64_t numFrames,Generator *generator,uint32_t oversamplingFactor)

{
  ChannelArrayView<const_float> source;
  ChannelArrayView<const_float> source_00;
  uint uVar1;
  undefined8 extraout_RDX;
  float *pfVar2;
  uint uVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  SampleIterator<float> SVar4;
  ChannelArrayBuffer<float> data;
  ChannelArrayBuffer<float> resampledData;
  undefined4 uStack_54;
  undefined4 uStack_3c;
  
  if ((((0x14996fff < numFrames) || (sampleRate <= 0.0)) || (frequency <= 0.0)) || (numFrames < 1))
  {
    (__return_storage_ptr__->packedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->packedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->packedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
         (_func_int **)&PTR__SimpleStringDictionary_002f65c0;
    (__return_storage_ptr__->value).type.content.object = (Object *)0x0;
    (__return_storage_ptr__->value).type.allocator = (Allocator *)0x0;
    (__return_storage_ptr__->value).data = (uint8_t *)0x0;
    (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->dictionary).strings.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->dictionary).strings.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 1) = 0;
    (__return_storage_ptr__->value).stringDictionary =
         &(__return_storage_ptr__->dictionary).super_StringDictionary;
  }
  else {
    choc::buffer::AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout>::AllocatedBuffer
              ((AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> *)&data.view,1,
               (FrameCount)numFrames * oversamplingFactor);
    uVar3 = 0;
    SVar4 = choc::buffer::BufferView<float,_choc::buffer::SeparateChannelLayout>::getIterator
                      (&data.view,0);
    generator->phaseIncrement = frequency / ((double)oversamplingFactor * sampleRate);
    uVar1 = SVar4.stride;
    while( true ) {
      pfVar2 = SVar4.sample;
      if (data.view.size.numFrames <= uVar3) break;
      (*generator->_vptr_Generator[2])(generator);
      *pfVar2 = (float)(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      WaveGenerators::Generator::advance(generator);
      uVar3 = uVar3 + 1;
      SVar4._8_8_ = extraout_RDX;
      SVar4.sample = pfVar2 + uVar1;
    }
    if (oversamplingFactor == 1) {
      source.size.numFrames = data.view.size.numFrames;
      source.size.numChannels = data.view.size.numChannels;
      source.data._12_4_ = uStack_3c;
      source.data.offset = data.view.data.offset;
      source.data.channels = data.view.data.channels;
      convertAudioDataToObject(__return_storage_ptr__,source,sampleRate);
    }
    else {
      choc::buffer::AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout>::AllocatedBuffer
                (&resampledData,1,(FrameCount)numFrames);
      resampleToFit<choc::buffer::AllocatedBuffer<float,choc::buffer::SeparateChannelLayout>&,choc::buffer::AllocatedBuffer<float,choc::buffer::SeparateChannelLayout>>
                (&resampledData,&data,0x32);
      source_00.data._12_4_ = uStack_54;
      source_00.data.offset = resampledData.view.data.offset;
      source_00.data.channels = resampledData.view.data.channels;
      source_00.size = resampledData.view.size;
      convertAudioDataToObject(__return_storage_ptr__,source_00,sampleRate);
      choc::buffer::SeparateChannelLayout<float>::freeAllocatedData
                ((SeparateChannelLayout<float> *)&resampledData);
    }
    choc::buffer::SeparateChannelLayout<float>::freeAllocatedData
              ((SeparateChannelLayout<float> *)&data);
  }
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value generateWaveform (double frequency, double sampleRate, int64_t numFrames,
                                     WaveGenerators::Generator& generator,
                                     uint32_t oversamplingFactor)
{
    if (numFrames > 0 && frequency > 0 && sampleRate > 0 && numFrames < 48000 * 60 * 60 * 2)
    {
        choc::buffer::ChannelArrayBuffer<float> data (1, (uint32_t) (numFrames * oversamplingFactor));
        auto dst = data.getIterator (0);

        generator.init (frequency, sampleRate * oversamplingFactor);

        for (uint32_t i = 0; i < data.getNumFrames(); ++i)
        {
            *dst = (float) generator.getSample();
            ++dst;
            generator.advance();
        }

        if (oversamplingFactor == 1)
            return convertAudioDataToObject (data, sampleRate);

        // Resample to the right size
        choc::buffer::ChannelArrayBuffer<float> resampledData (1, (uint32_t) numFrames);
        resampleToFit (resampledData, data);
        return convertAudioDataToObject (resampledData, sampleRate);
    }

    return {};
}